

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.h
# Opt level: O0

void __thiscall
GCPtr<symbols::Object>::GCPtr(GCPtr<symbols::Object> *this,GCPtr<symbols::Object> *ob)

{
  pointer pGVar1;
  _List_iterator<GCInfo<symbols::Object>_> local_20;
  iterator p;
  GCPtr<symbols::Object> *ob_local;
  GCPtr<symbols::Object> *this_local;
  
  p._M_node = (_List_node_base *)ob;
  std::_List_iterator<GCInfo<symbols::Object>_>::_List_iterator(&local_20);
  local_20._M_node = (_List_node_base *)findPtrInfo(this,(p._M_node)->_M_next);
  pGVar1 = std::_List_iterator<GCInfo<symbols::Object>_>::operator->(&local_20);
  pGVar1->refcount = pGVar1->refcount + 1;
  this->addr = (Object *)(p._M_node)->_M_next;
  return;
}

Assistant:

GCPtr(const GCPtr &ob){
        typename list<GCInfo<T>>::iterator p;
        p = findPtrInfo(ob.addr);
        p->refcount++; // increment ref count

        addr = ob.addr;
        #ifdef DISPLAY
            cout << "Constructing GCPtr copy." << endl;
        #endif
    }